

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_terrain.h
# Opt level: O2

void __thiscall FTerrainTypeArray::Set(FTerrainTypeArray *this,int index,int value)

{
  uint uVar1;
  
  uVar1 = (this->Types).Count;
  if (uVar1 <= (uint)index) {
    TArray<unsigned_short,_unsigned_short>::Resize(&this->Types,index + 1U);
    memset((this->Types).Array + (int)uVar1,0xff,(long)(int)((index + 1U) - uVar1) * 2);
  }
  (this->Types).Array[index] = (unsigned_short)value;
  return;
}

Assistant:

void Set(int index, int value)
	{
		if ((unsigned)index >= Types.Size())
		{
			int oldsize = Types.Size();
			Resize(index + 1);
			memset(&Types[oldsize], 0xff, (index + 1 - oldsize)*sizeof(WORD));
		}
		Types[index] = value;
	}